

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dothrow.c
# Opt level: O3

void mhurtle(monst *mon,int dx,int dy,int range)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  coord cc;
  coord mc;
  coord local_24;
  coord local_22;
  
  mon->movement = 0;
  uVar1 = *(uint *)&mon->field_0x60;
  *(uint *)&mon->field_0x60 = uVar1 | 0x100000;
  if ((uVar1 >> 0x17 & 1) == 0 && (u.ustuck != mon && mon->data->msize < 4)) {
    iVar2 = sgn(dx);
    iVar3 = sgn(dy);
    if ((range != 0) && (iVar2 != 0 || iVar3 != 0)) {
      walk_path(&local_22,&local_24,mhurtle_step,mon);
    }
  }
  return;
}

Assistant:

void mhurtle(struct monst *mon, int dx, int dy, int range)
{
    coord mc, cc;

	/* At the very least, debilitate the monster */
	mon->movement = 0;
	mon->mstun = 1;

	/* Is the monster stuck or too heavy to push?
	 * (very large monsters have too much inertia, even floaters and flyers)
	 */
	if (mon->data->msize >= MZ_HUGE || mon == u.ustuck || mon->mtrapped)
	    return;

    /* Make sure dx and dy are [-1,0,1] */
    dx = sgn(dx);
    dy = sgn(dy);
    if (!range || (!dx && !dy)) return; /* paranoia */

	/* Send the monster along the path */
	mc.x = mon->mx;
	mc.y = mon->my;
	cc.x = mon->mx + (dx * range);
	cc.y = mon->my + (dy * range);
	walk_path(&mc, &cc, mhurtle_step, mon);
	return;
}